

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O2

_Bool intersect_tri3_sphere(vec3_t v0,vec3_t v1,vec3_t v2,vec3_t center,float radius)

{
  segment3_t seg;
  segment3_t seg_00;
  segment3_t seg_01;
  float fVar1;
  float fVar2;
  float fVar3;
  vec3_t vVar4;
  vec3_t b;
  plane_t p;
  segment3_t s_2;
  segment3_t s_1;
  segment3_t s;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 local_58;
  undefined4 uStack_54;
  
  fVar1 = v0.z;
  vVar4 = tri3_get_point_barycentric_coordinates(v0,v1,v2,center);
  local_98 = v0.x;
  uStack_94 = v0.y;
  local_68 = v1.x;
  uStack_64 = v1.y;
  local_58 = v2.x;
  uStack_54 = v2.y;
  if ((((vVar4.x < 0.0) || (1.0 < vVar4.x)) || (vVar4.y < 0.0)) ||
     (((1.0 < vVar4.y || (vVar4.z < 0.0)) || (1.0 < vVar4.z)))) {
    seg.e.x = local_68;
    seg.s.z = fVar1;
    seg.s.x = (float)(int)v0._0_8_;
    seg.s.y = (float)(int)((ulong)v0._0_8_ >> 0x20);
    seg.e.y = (float)(int)v1._4_8_;
    seg.e.z = (float)(int)((ulong)v1._4_8_ >> 0x20);
    fVar1 = distance_to_segment3(seg,center);
    seg_00.e.x = local_58;
    seg_00.s.z = v1.z;
    seg_00.s.x = (float)(int)v1._0_8_;
    seg_00.s.y = (float)(int)((ulong)v1._0_8_ >> 0x20);
    seg_00.e.y = (float)(int)v2._4_8_;
    seg_00.e.z = (float)(int)((ulong)v2._4_8_ >> 0x20);
    fVar2 = distance_to_segment3(seg_00,center);
    seg_01.e.x = local_98;
    seg_01.s.z = v2.z;
    seg_01.s.x = (float)(int)v2._0_8_;
    seg_01.s.y = (float)(int)((ulong)v2._0_8_ >> 0x20);
    seg_01.e.y = (float)(int)v0._4_8_;
    seg_01.e.z = (float)(int)((ulong)v0._4_8_ >> 0x20);
    fVar3 = distance_to_segment3(seg_01,center);
    if (fVar3 <= fVar2) {
      fVar2 = fVar3;
    }
    if (fVar2 <= fVar1) {
      fVar1 = fVar2;
    }
  }
  else {
    vVar4.x = local_68 - local_98;
    vVar4.y = uStack_64 - uStack_94;
    vVar4.z = v1.z - fVar1;
    b.x = local_58 - local_98;
    b.y = uStack_54 - uStack_94;
    b.z = v2.z - fVar1;
    vVar4 = vec3_cross(vVar4,b);
    vVar4 = vec3_normalize(vVar4);
    p = plane_from(vVar4,-(fVar1 * vVar4.z + local_98 * vVar4.x + uStack_94 * vVar4.y));
    fVar1 = distance_to_plane(p,center);
  }
  return fVar1 <= radius;
}

Assistant:

bool
intersect_tri3_sphere(vec3_t v0, vec3_t v1, vec3_t v2, vec3_t center, float radius) {
    vec3_t  uvw = tri3_get_point_barycentric_coordinates(v0, v1, v2, center);
    if( is_in_0_1_range(uvw.x) && is_in_0_1_range(uvw.y) && is_in_0_1_range(uvw.z) ) {
        plane_t p   = tri3_plane(v0, v1, v2);
        if( distance_to_plane(p, center) <= radius ) {
            return true;
        } else {
            return false;
        }
    } else {    // point is outside, check the distance from center to segments
        float   d0  = distance_to_segment3(segment3(v0, v1), center);
        float   d1  = distance_to_segment3(segment3(v1, v2), center);
        float   d2  = distance_to_segment3(segment3(v2, v0), center);
        float   m   = MIN(d0, MIN(d1, d2));
        if( m <= radius ) {
            return true;
        } else {
            return false;
        }
    }
}